

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::on_i2p_resolve(torrent *this,error_code *ec,char *dest)

{
  peer_list *this_00;
  int iVar1;
  size_t sVar2;
  torrent_peer *ptVar3;
  pointer pptVar4;
  string_view destination;
  torrent_state st;
  torrent_state local_d0;
  
  if ((ec->failed_ == true) &&
     (iVar1 = (*(this->super_request_callback)._vptr_request_callback[6])(this), (char)iVar1 != '\0'
     )) {
    (*ec->cat_->_vptr_error_category[4])(&local_d0,ec->cat_,(ulong)(uint)ec->val_);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"i2p_resolve error: %s",local_d0._0_8_);
    if (local_d0._0_8_ != (long)&local_d0 + 0x10U) {
      operator_delete((void *)local_d0._0_8_,local_d0.ip.m_addresses[0][0]._0_8_ + 1);
    }
  }
  if (((ec->failed_ == false) && (((this->super_torrent_hot_members).field_0x4b & 4) == 0)) &&
     (iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x11])(), (char)iVar1 == '\0')) {
    need_peer_list(this);
    get_peer_list_state(&local_d0,this);
    this_00 = (this->super_torrent_hot_members).m_peer_list._M_t.
              super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
              .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
    sVar2 = strlen(dest);
    destination._M_str = dest;
    destination._M_len = sVar2;
    ptVar3 = peer_list::add_i2p_peer
                       (this_00,destination,(peer_source_flags_t)0x1,(pex_flags_t)0x0,&local_d0);
    if (ptVar3 != (torrent_peer *)0x0) {
      state_updated(this);
    }
    pptVar4 = local_d0.erased.
              super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->super_torrent_hot_members).m_picker._M_t.
        super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
        .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
        (piece_picker *)0x0) {
      for (; pptVar4 !=
             local_d0.erased.
             super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
        piece_picker::clear_peer
                  ((this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                   *pptVar4);
      }
    }
    update_want_peers(this);
    if (local_d0.erased.
        super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.erased.
                      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.erased.
                            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.erased.
                            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void torrent::on_i2p_resolve(error_code const& ec, char const* dest) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		COMPLETE_ASYNC("torrent::on_i2p_resolve");
#ifndef TORRENT_DISABLE_LOGGING
		if (ec && should_log())
			debug_log("i2p_resolve error: %s", ec.message().c_str());
#endif
		if (ec || m_abort || m_ses.is_aborted()) return;

		need_peer_list();
		torrent_state st = get_peer_list_state();
		if (m_peer_list->add_i2p_peer(dest, peer_info::tracker, {}, &st))
			state_updated();
		peers_erased(st.erased);

		update_want_peers();
	}
	catch (...) { handle_exception(); }